

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O0

DdNode * Extra_bddNodePointedByCube(DdManager *dd,DdNode *bF,DdNode *bC)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  int LevelC;
  int LevelF;
  DdNode *bC1;
  DdNode *bC0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bCR;
  DdNode *bFR;
  DdNode *bC_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  if (bC == (DdNode *)((ulong)dd->one ^ 1)) {
    __assert_fail("bC != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                  ,0xcd,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
  }
  dd_local = (DdManager *)bF;
  if (bC != dd->one) {
    pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
    pDVar2 = (DdNode *)((ulong)bC & 0xfffffffffffffffe);
    if (pDVar1->index == 0x7fffffff) {
      __assert_fail("!cuddIsConstant( bFR )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                    ,0xdb,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
    }
    bC0 = bF;
    bF1 = bF;
    if (dd->perm[pDVar1->index] <= dd->perm[pDVar2->index]) {
      if (pDVar1 == bF) {
        bF1 = (pDVar1->type).kids.E;
        bC0 = (pDVar1->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
        bC0 = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
      }
    }
    _LevelC = bC;
    bC1 = bC;
    if (dd->perm[pDVar2->index] <= dd->perm[pDVar1->index]) {
      if (pDVar2 == bC) {
        bC1 = (pDVar2->type).kids.E;
        _LevelC = (pDVar2->type).kids.T;
      }
      else {
        bC1 = (DdNode *)((ulong)(pDVar2->type).kids.E ^ 1);
        _LevelC = (DdNode *)((ulong)(pDVar2->type).kids.T ^ 1);
      }
    }
    if ((bC1 != (DdNode *)((ulong)dd->one ^ 1)) && (_LevelC != (DdNode *)((ulong)dd->one ^ 1))) {
      __assert_fail("bC0 == b0 || bC1 == b0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdLocal.c"
                    ,0x104,"DdNode *Extra_bddNodePointedByCube(DdManager *, DdNode *, DdNode *)");
    }
    if (bC1 == (DdNode *)((ulong)dd->one ^ 1)) {
      dd_local = (DdManager *)Extra_bddNodePointedByCube(dd,bC0,_LevelC);
    }
    else {
      dd_local = (DdManager *)Extra_bddNodePointedByCube(dd,bF1,bC1);
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Extra_bddNodePointedByCube( DdManager * dd, DdNode * bF, DdNode * bC )
{
    DdNode * bFR, * bCR;
    DdNode * bF0, * bF1;
    DdNode * bC0, * bC1;
    int LevelF, LevelC;

    assert( bC != b0 );
    if ( bC == b1 )
        return bF;

//    bRes = cuddCacheLookup2( dd, Extra_bddNodePointedByCube, bF, bC );
//    if ( bRes )
//      return bRes;
    // there is no need for caching because this operation is very fast
    // there will no gain reusing the results of this operations
    // instead, it will flush CUDD cache of other useful entries


    bFR = Cudd_Regular( bF ); 
    bCR = Cudd_Regular( bC ); 
    assert( !cuddIsConstant( bFR ) );

    LevelF = dd->perm[bFR->index];
    LevelC = dd->perm[bCR->index];

    if ( LevelF <= LevelC )
    {
        if ( bFR != bF )
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }
    }
    else
    {
        bF0 = bF1 = bF;
    }

    if ( LevelC <= LevelF )
    {
        if ( bCR != bC )
        {
            bC0 = Cudd_Not( cuddE(bCR) );
            bC1 = Cudd_Not( cuddT(bCR) );
        }
        else
        {
            bC0 = cuddE(bCR);
            bC1 = cuddT(bCR);
        }
    }
    else
    {
        bC0 = bC1 = bC;
    }

    assert( bC0 == b0 || bC1 == b0 );
    if ( bC0 == b0 )
        return Extra_bddNodePointedByCube( dd, bF1, bC1 );
    return Extra_bddNodePointedByCube( dd, bF0, bC0 );
}